

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::String::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value,int width)

{
  ostream *this_00;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = std::operator<<(local_198,0x30);
  *(long *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = (long)value;
  std::ostream::operator<<(this_00,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidthN(int value, int width) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(width) << value;
  return ss.str();
}